

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::SetExplicitFreeBitOnSmallBlock<SmallAllocationBlockAttributes>
          (Recycler *this,HeapBlock *heapBlock,size_t sizeCat,void *buffer,ObjectInfoBits attributes
          )

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  char *message;
  char *error;
  uint lineNumber;
  
  if (heapBlock->heapBlockType == LargeBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x46f,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()");
    if (!bVar2) goto LAB_00691420;
    *puVar4 = 0;
  }
  iVar3 = (*heapBlock->_vptr_HeapBlock[9])(heapBlock,buffer);
  if (CONCAT44(extraout_var,iVar3) != sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x470,"(heapBlock->GetObjectSize(buffer) == sizeCat)",
                       "heapBlock->GetObjectSize(buffer) == sizeCat");
    if (!bVar2) goto LAB_00691420;
    *puVar4 = 0;
  }
  if ((attributes & LeafBit) == NoBit) {
    bVar2 = HeapBlock::IsAnyNormalBlock(heapBlock);
    if (bVar2) goto LAB_00691407;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(smallBlock->IsAnyNormalBlock())";
    message = "smallBlock->IsAnyNormalBlock()";
    lineNumber = 0x478;
  }
  else {
    if ((heapBlock->heapBlockType == SmallLeafBlockType) ||
       (heapBlock->heapBlockType == MediumLeafBlockType)) goto LAB_00691407;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(smallBlock->IsLeafBlock())";
    message = "smallBlock->IsLeafBlock()";
    lineNumber = 0x474;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                     ,lineNumber,error,message);
  if (!bVar2) {
LAB_00691420:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00691407:
  SmallHeapBlockT<SmallAllocationBlockAttributes>::SetExplicitFreeBitForObject
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,buffer);
  return;
}

Assistant:

void Recycler::SetExplicitFreeBitOnSmallBlock(HeapBlock* heapBlock, size_t sizeCat, void* buffer, ObjectInfoBits attributes)
{
    Assert(!heapBlock->IsLargeHeapBlock());
    Assert(heapBlock->GetObjectSize(buffer) == sizeCat);
    SmallHeapBlockT<TBlockAttributes>* smallBlock = (SmallHeapBlockT<TBlockAttributes>*)heapBlock;
    if ((attributes & ObjectInfoBits::LeafBit) == LeafBit)
    {
        Assert(smallBlock->IsLeafBlock());
    }
    else
    {
        Assert(smallBlock->IsAnyNormalBlock());
    }


#ifdef RECYCLER_MEMORY_VERIFY
    smallBlock->SetExplicitFreeBitForObject(buffer);
#endif
}